

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

void sysbvm_gc_safepoint(sysbvm_context_t *context)

{
  ulong *puVar1;
  uint uVar2;
  ulong in_RAX;
  size_t sVar3;
  ulong uVar4;
  ulong *pointerAddress;
  sysbvm_object_tuple_t *objectTuple;
  long in_FS_OFFSET;
  ulong local_38;
  
  if (((*(int *)(in_FS_OFFSET + -0x20) != 0) || ((context->heap).shouldAttemptToCollect != true)) ||
     (context->gcDisabled != false)) {
    return;
  }
  local_38 = in_RAX;
  sysbvm_gc_iterateRoots(context,context,sysbvm_gc_markPointer);
  sVar3 = (context->markingStack).size;
  do {
    if (sVar3 == 0) {
      sysbvm_heap_replaceWeakReferencesWithTombstones(&context->heap);
      sysbvm_heap_sweep(&context->heap);
      sysbvm_heap_swapGCColors(&context->heap);
      return;
    }
    (context->markingStack).size = sVar3 - 1;
    puVar1 = *(ulong **)((context->markingStack).data + sVar3 * 8 + -8);
    uVar4 = (ulong)puVar1 & 0xf;
    if (puVar1 == (ulong *)0x0 || uVar4 != 0) {
      if ((int)uVar4 == 0xf) {
        local_38 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)puVar1 >> 4);
      }
      else {
        local_38 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar4);
      }
      sysbvm_gc_markPointer(context,&local_38);
    }
    else {
      uVar4 = *puVar1;
      local_38 = uVar4;
      sysbvm_gc_markPointer(context,&local_38);
      uVar2 = (uint)puVar1[1] & 0x300;
      if (uVar2 != 0x200) {
        if (uVar2 == 0x100) {
          if ((uVar4 & 0xf) != 0 || uVar4 == 0) goto LAB_00113873;
          sVar3 = sysbvm_type_getTotalSlotCount(uVar4);
        }
        else {
          sVar3 = (size_t)(*(uint *)((long)puVar1 + 0xc) >> 3);
        }
        if (sVar3 != 0) {
          pointerAddress = puVar1 + 2;
          do {
            sysbvm_gc_markPointer(context,pointerAddress);
            pointerAddress = pointerAddress + 1;
            sVar3 = sVar3 - 1;
          } while (sVar3 != 0);
        }
      }
    }
LAB_00113873:
    *(uint *)(puVar1 + 1) = (uint)puVar1[1] & 0xfffffffc | (context->heap).gcBlackColor;
    sVar3 = (context->markingStack).size;
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_gc_safepoint(sysbvm_context_t *context)
{
    if(sysbvm_gc_perThreadLockCount != 0)
        return;

    // Check the attempt collection flag on the heap.
    if(!context->heap.shouldAttemptToCollect || context->gcDisabled)
        return;

    // TODO: Add Support for multiple threads.

    // Hook location for validating GC stack roots via GDB scripting.
    sysbvm_gc_debugStackValidationHook();
    sysbvm_gc_performCycle(context);
}